

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

LY_ERR xpath_local_name(lyxp_set **args,uint32_t arg_count,lyxp_set *set,uint32_t options)

{
  ly_ctx *plVar1;
  lyxp_set_meta *plVar2;
  lyd_meta *plVar3;
  int iVar4;
  char *pcVar5;
  lysc_type **pplVar6;
  size_t sVar7;
  lyxp_set *plVar8;
  uint32_t str_len;
  lysc_type *__s;
  
  if ((options & 0x1c) != 0) {
    set_scnode_clear_ctx(set,0);
    return LY_SUCCESS;
  }
  if (arg_count == 0) {
    if (set->type != LYXP_SET_NODE_SET) {
      plVar1 = set->ctx;
      pcVar5 = print_set_type(set);
      ly_vlog(plVar1,(char *)0x0,LYVE_XPATH,"Invalid context type %s in %s.",pcVar5,
              "local-name(node-set?)");
      return LY_EVALID;
    }
    if (set->used != 0) {
      iVar4 = set_sort(set);
      plVar8 = set;
      if (iVar4 != 0) {
        __assert_fail("!set_sort(set)",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                      ,0x11c8,
                      "LY_ERR xpath_local_name(struct lyxp_set **, uint32_t, struct lyxp_set *, uint32_t)"
                     );
      }
      goto LAB_001a7166;
    }
switchD_001a7183_caseD_1:
    __s = (lysc_type *)0x1c9aa8;
    str_len = 0;
  }
  else {
    plVar8 = *args;
    if (plVar8->type != LYXP_SET_NODE_SET) {
      plVar1 = set->ctx;
      pcVar5 = print_set_type(plVar8);
      ly_vlog(plVar1,(char *)0x0,LYVE_XPATH,
              "Wrong type of argument #%d (%s) for the XPath function %s.",1,pcVar5,
              "local-name(node-set?)");
      return LY_EVALID;
    }
    if (plVar8->used == 0) goto switchD_001a7183_caseD_1;
    iVar4 = set_sort(plVar8);
    if (iVar4 != 0) {
      __assert_fail("!set_sort(args[0])",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                    ,0x11bb,
                    "LY_ERR xpath_local_name(struct lyxp_set **, uint32_t, struct lyxp_set *, uint32_t)"
                   );
    }
    plVar8 = *args;
LAB_001a7166:
    plVar2 = (plVar8->val).meta;
    switch(plVar2->type) {
    case LYXP_NODE_NONE:
      ly_log(set->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c",0x11cf
            );
      return LY_EINT;
    case LYXP_NODE_ROOT:
    case LYXP_NODE_ROOT_CONFIG:
    case LYXP_NODE_TEXT:
      goto switchD_001a7183_caseD_1;
    case LYXP_NODE_ELEM:
      plVar3 = plVar2->meta->next;
      pplVar6 = (lysc_type **)((long)&(plVar2->meta->value).field_2 + 0x10);
      if (plVar3 != (lyd_meta *)0x0) {
        pplVar6 = &(plVar3->value).realtype;
      }
      __s = *pplVar6;
      break;
    case LYXP_NODE_META:
      __s = (lysc_type *)plVar2->meta->name;
      break;
    default:
      goto switchD_001a7183_default;
    }
    sVar7 = strlen((char *)__s);
    str_len = (uint32_t)sVar7;
  }
  set_fill_string(set,(char *)__s,str_len);
switchD_001a7183_default:
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
xpath_local_name(struct lyxp_set **args, uint32_t arg_count, struct lyxp_set *set, uint32_t options)
{
    struct lyxp_set_node *item;

    /* suppress unused variable warning */
    (void)options;

    if (options & LYXP_SCNODE_ALL) {
        set_scnode_clear_ctx(set, LYXP_SET_SCNODE_ATOM_NODE);
        return LY_SUCCESS;
    }

    if (arg_count) {
        if (args[0]->type != LYXP_SET_NODE_SET) {
            LOGVAL(set->ctx, LY_VCODE_XP_INARGTYPE, 1, print_set_type(args[0]),
                    "local-name(node-set?)");
            return LY_EVALID;
        } else if (!args[0]->used) {
            set_fill_string(set, "", 0);
            return LY_SUCCESS;
        }

        /* we need the set sorted, it affects the result */
        assert(!set_sort(args[0]));

        item = &args[0]->val.nodes[0];
    } else {
        if (set->type != LYXP_SET_NODE_SET) {
            LOGVAL(set->ctx, LY_VCODE_XP_INCTX, print_set_type(set), "local-name(node-set?)");
            return LY_EVALID;
        } else if (!set->used) {
            set_fill_string(set, "", 0);
            return LY_SUCCESS;
        }

        /* we need the set sorted, it affects the result */
        assert(!set_sort(set));

        item = &set->val.nodes[0];
    }

    switch (item->type) {
    case LYXP_NODE_NONE:
        LOGINT_RET(set->ctx);
    case LYXP_NODE_ROOT:
    case LYXP_NODE_ROOT_CONFIG:
    case LYXP_NODE_TEXT:
        set_fill_string(set, "", 0);
        break;
    case LYXP_NODE_ELEM:
        set_fill_string(set, LYD_NAME(item->node), strlen(LYD_NAME(item->node)));
        break;
    case LYXP_NODE_META:
        set_fill_string(set, ((struct lyd_meta *)item->node)->name, strlen(((struct lyd_meta *)item->node)->name));
        break;
    }

    return LY_SUCCESS;
}